

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_sinc_resampler.cc
# Opt level: O0

size_t __thiscall
webrtc::PushSincResampler::Resample
          (PushSincResampler *this,float *source,size_t source_length,float *destination,
          size_t destination_capacity)

{
  pointer pSVar1;
  pointer this_00;
  size_t frames;
  FatalMessage local_348;
  string *local_1d0;
  string *_result_1;
  FatalMessage local_1b8;
  size_t local_40;
  string *local_38;
  string *_result;
  size_t destination_capacity_local;
  float *destination_local;
  size_t source_length_local;
  float *source_local;
  PushSincResampler *this_local;
  
  _result = (string *)destination_capacity;
  destination_capacity_local = (size_t)destination;
  destination_local = (float *)source_length;
  source_length_local = (size_t)source;
  source_local = (float *)this;
  pSVar1 = std::unique_ptr<webrtc::SincResampler,_std::default_delete<webrtc::SincResampler>_>::
           operator->(&this->resampler_);
  local_40 = SincResampler::request_frames(pSVar1);
  local_38 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       ((unsigned_long *)&destination_local,&local_40,
                        "source_length == resampler_->request_frames()");
  if (local_38 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/push_sinc_resampler.cc"
               ,0x35,local_38);
    rtc::FatalMessage::stream(&local_1b8);
    rtc::FatalMessage::~FatalMessage(&local_1b8);
  }
  local_1d0 = rtc::CheckGEImpl<unsigned_long,unsigned_long>
                        ((unsigned_long *)&_result,&this->destination_frames_,
                         "destination_capacity >= destination_frames_");
  if (local_1d0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/push_sinc_resampler.cc"
               ,0x36,local_1d0);
    rtc::FatalMessage::stream(&local_348);
    rtc::FatalMessage::~FatalMessage(&local_348);
  }
  this->source_ptr_ = (float *)source_length_local;
  this->source_available_ = (size_t)destination_local;
  if ((this->first_pass_ & 1U) != 0) {
    pSVar1 = std::unique_ptr<webrtc::SincResampler,_std::default_delete<webrtc::SincResampler>_>::
             operator->(&this->resampler_);
    this_00 = std::unique_ptr<webrtc::SincResampler,_std::default_delete<webrtc::SincResampler>_>::
              operator->(&this->resampler_);
    frames = SincResampler::ChunkSize(this_00);
    SincResampler::Resample(pSVar1,frames,(float *)destination_capacity_local);
  }
  pSVar1 = std::unique_ptr<webrtc::SincResampler,_std::default_delete<webrtc::SincResampler>_>::
           operator->(&this->resampler_);
  SincResampler::Resample(pSVar1,this->destination_frames_,(float *)destination_capacity_local);
  this->source_ptr_ = (float *)0x0;
  return this->destination_frames_;
}

Assistant:

size_t PushSincResampler::Resample(const float* source,
                                   size_t source_length,
                                   float* destination,
                                   size_t destination_capacity) {
  RTC_CHECK_EQ(source_length, resampler_->request_frames());
  RTC_CHECK_GE(destination_capacity, destination_frames_);
  // Cache the source pointer. Calling Resample() will immediately trigger
  // the Run() callback whereupon we provide the cached value.
  source_ptr_ = source;
  source_available_ = source_length;

  // On the first pass, we call Resample() twice. During the first call, we
  // provide dummy input and discard the output. This is done to prime the
  // SincResampler buffer with the correct delay (half the kernel size), thereby
  // ensuring that all later Resample() calls will only result in one input
  // request through Run().
  //
  // If this wasn't done, SincResampler would call Run() twice on the first
  // pass, and we'd have to introduce an entire |source_frames| of delay, rather
  // than the minimum half kernel.
  //
  // It works out that ChunkSize() is exactly the amount of output we need to
  // request in order to prime the buffer with a single Run() request for
  // |source_frames|.
  if (first_pass_)
    resampler_->Resample(resampler_->ChunkSize(), destination);

  resampler_->Resample(destination_frames_, destination);
  source_ptr_ = nullptr;
  return destination_frames_;
}